

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds04_playlist.cpp
# Opt level: O1

void __thiscall
CP::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::check
          (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  node *pnVar1;
  int iVar2;
  
  pnVar1 = this->mHeader;
  for (iVar2 = (int)this->mSize + 1; iVar2 != 0; iVar2 = iVar2 + -1) {
    pnVar1 = pnVar1->next;
  }
  if (pnVar1 != this->mHeader) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"next POINTER ERROR",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
  }
  pnVar1 = this->mHeader;
  for (iVar2 = (int)this->mSize + 1; iVar2 != 0; iVar2 = iVar2 + -1) {
    pnVar1 = pnVar1->prev;
  }
  if (pnVar1 == this->mHeader) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"prev POINTER ERROR",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  return;
}

Assistant:

void check() {
      node* p;
      int n;
      p = mHeader;
      n = mSize+1;
      while (n--) p = p->next;
      if (p != mHeader) {
        std::cout << "next POINTER ERROR" << std::endl;
      }
      p = mHeader;
      n = mSize+1;
      while (n--) p = p->prev;
      if (p != mHeader) {
        std::cout << "prev POINTER ERROR" << std::endl;
      }
    }